

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O1

void av1_fwd_txfm2d_64x64_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int8_t iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  int16_t *piVar9;
  long lVar10;
  __m256i *palVar11;
  undefined1 *puVar12;
  byte *pbVar13;
  ulong uVar14;
  longlong *plVar15;
  longlong *plVar16;
  __m256i *out;
  bool bVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  __m256i buf0 [512];
  __m256i buf1 [512];
  undefined1 local_80a0 [30];
  int8_t local_8082;
  int8_t local_8081;
  int16_t *local_8080;
  byte *local_8078;
  int32_t *local_8070;
  long local_8068;
  longlong local_8060 [4];
  longlong local_8040 [2044];
  longlong local_4060 [2];
  longlong alStack_4050 [2052];
  
  puVar12 = local_80a0;
  local_8081 = '\r';
  local_8082 = '\n';
  plVar15 = local_8060;
  plVar16 = local_8040;
  lVar7 = 0;
  local_8078 = (byte *)av1_fwd_txfm_shift_ls[4];
  local_8070 = output;
  do {
    iVar5 = local_8081;
    lVar10 = 0;
    piVar9 = input;
    do {
      uVar2 = *(undefined8 *)(piVar9 + 4);
      uVar3 = *(undefined8 *)(piVar9 + 8);
      uVar4 = *(undefined8 *)(piVar9 + 0xc);
      *(undefined8 *)((long)local_4060 + lVar10) = *(undefined8 *)piVar9;
      *(undefined8 *)((long)local_4060 + lVar10 + 8) = uVar2;
      *(undefined8 *)((long)alStack_4050 + lVar10) = uVar3;
      *(undefined8 *)((long)alStack_4050 + lVar10 + 8) = uVar4;
      lVar10 = lVar10 + 0x20;
      piVar9 = piVar9 + stride;
    } while (lVar10 != 0x800);
    lVar10 = 0;
    do {
      auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)local_4060 + lVar10));
      auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)alStack_4050 + lVar10));
      *(undefined1 (*) [32])(plVar16 + lVar10 + -4) = auVar18;
      *(undefined1 (*) [32])(plVar16 + lVar10) = auVar19;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x800);
    bVar1 = *local_8078;
    uVar8 = (uint)(char)bVar1;
    if ((int)uVar8 < 0) {
      iVar6 = 1 << (~bVar1 & 0x1f);
      auVar18._4_4_ = iVar6;
      auVar18._0_4_ = iVar6;
      auVar18._8_4_ = iVar6;
      auVar18._12_4_ = iVar6;
      auVar18._16_4_ = iVar6;
      auVar18._20_4_ = iVar6;
      auVar18._24_4_ = iVar6;
      auVar18._28_4_ = iVar6;
      lVar10 = 0;
      do {
        auVar19 = vpaddd_avx2(auVar18,*(undefined1 (*) [32])((long)plVar15 + lVar10));
        auVar19 = vpsrad_avx2(auVar19,ZEXT416(-uVar8));
        *(undefined1 (*) [32])((long)plVar15 + lVar10) = auVar19;
        lVar10 = lVar10 + 0x100;
      } while (lVar10 != 0x4000);
    }
    else if (bVar1 != 0) {
      lVar10 = 0;
      do {
        auVar18 = vpslld_avx2(*(undefined1 (*) [32])((long)plVar15 + lVar10),ZEXT416(uVar8));
        *(undefined1 (*) [32])((long)plVar15 + lVar10) = auVar18;
        lVar10 = lVar10 + 0x100;
      } while (lVar10 != 0x4000);
    }
    bVar1 = *local_8078;
    uVar8 = (uint)(char)bVar1;
    if ((int)uVar8 < 0) {
      iVar6 = 1 << (~bVar1 & 0x1f);
      auVar19._4_4_ = iVar6;
      auVar19._0_4_ = iVar6;
      auVar19._8_4_ = iVar6;
      auVar19._12_4_ = iVar6;
      auVar19._16_4_ = iVar6;
      auVar19._20_4_ = iVar6;
      auVar19._24_4_ = iVar6;
      auVar19._28_4_ = iVar6;
      lVar10 = 0;
      do {
        auVar18 = vpaddd_avx2(auVar19,*(undefined1 (*) [32])((long)plVar16 + lVar10));
        auVar18 = vpsrad_avx2(auVar18,ZEXT416(-uVar8));
        *(undefined1 (*) [32])((long)plVar16 + lVar10) = auVar18;
        lVar10 = lVar10 + 0x100;
      } while (lVar10 != 0x4000);
    }
    else if (bVar1 != 0) {
      lVar10 = 0;
      do {
        auVar18 = vpslld_avx2(*(undefined1 (*) [32])((long)plVar16 + lVar10),ZEXT416(uVar8));
        *(undefined1 (*) [32])((long)plVar16 + lVar10) = auVar18;
        lVar10 = lVar10 + 0x100;
      } while (lVar10 != 0x4000);
    }
    pbVar13 = local_8078;
    local_8080 = input;
    local_8068 = lVar7;
    fdct64_avx2((__m256i *)(local_8060 + lVar7 * 8),(__m256i *)(local_8060 + lVar7 * 8),local_8081,8
                ,(int)local_8078);
    fdct64_avx2((__m256i *)(local_8040 + lVar7 * 8),(__m256i *)(local_8040 + lVar7 * 8),iVar5,8,
                (int)pbVar13);
    bVar1 = local_8078[1];
    if ((char)bVar1 < '\0') {
      iVar6 = 1 << (~bVar1 & 0x1f);
      auVar20._4_4_ = iVar6;
      auVar20._0_4_ = iVar6;
      auVar20._8_4_ = iVar6;
      auVar20._12_4_ = iVar6;
      auVar20._16_4_ = iVar6;
      auVar20._20_4_ = iVar6;
      auVar20._24_4_ = iVar6;
      auVar20._28_4_ = iVar6;
      lVar7 = 0;
      do {
        auVar18 = vpaddd_avx2(auVar20,*(undefined1 (*) [32])((long)plVar15 + lVar7));
        auVar18 = vpsrad_avx2(auVar18,ZEXT416((uint)-(int)(char)bVar1));
        *(undefined1 (*) [32])((long)plVar15 + lVar7) = auVar18;
        lVar7 = lVar7 + 0x100;
      } while (lVar7 != 0x4000);
    }
    else if (bVar1 != 0) {
      lVar7 = 0;
      do {
        auVar18 = vpslld_avx2(*(undefined1 (*) [32])((long)plVar15 + lVar7),
                              ZEXT416((uint)(int)(char)bVar1));
        *(undefined1 (*) [32])((long)plVar15 + lVar7) = auVar18;
        lVar7 = lVar7 + 0x100;
      } while (lVar7 != 0x4000);
    }
    bVar1 = local_8078[1];
    if ((char)bVar1 < '\0') {
      iVar6 = 1 << (~bVar1 & 0x1f);
      auVar21._4_4_ = iVar6;
      auVar21._0_4_ = iVar6;
      auVar21._8_4_ = iVar6;
      auVar21._12_4_ = iVar6;
      auVar21._16_4_ = iVar6;
      auVar21._20_4_ = iVar6;
      auVar21._24_4_ = iVar6;
      auVar21._28_4_ = iVar6;
      lVar7 = 0;
      do {
        auVar18 = vpaddd_avx2(auVar21,*(undefined1 (*) [32])((long)plVar16 + lVar7));
        auVar18 = vpsrad_avx2(auVar18,ZEXT416((uint)-(int)(char)bVar1));
        *(undefined1 (*) [32])((long)plVar16 + lVar7) = auVar18;
        lVar7 = lVar7 + 0x100;
      } while (lVar7 != 0x4000);
    }
    else if (bVar1 != 0) {
      lVar7 = 0;
      do {
        auVar18 = vpslld_avx2(*(undefined1 (*) [32])((long)plVar16 + lVar7),
                              ZEXT416((uint)(int)(char)bVar1));
        *(undefined1 (*) [32])((long)plVar16 + lVar7) = auVar18;
        lVar7 = lVar7 + 0x100;
      } while (lVar7 != 0x4000);
    }
    lVar7 = local_8068 + 1;
    input = local_8080 + 0x10;
    plVar16 = plVar16 + 8;
    plVar15 = plVar15 + 8;
  } while (lVar7 != 4);
  palVar11 = (__m256i *)local_4060;
  plVar15 = local_8060;
  pbVar13 = local_8078;
  uVar14 = 0;
  do {
    lVar7 = 0;
    out = palVar11;
    do {
      fwd_txfm_transpose_8x8_avx2((__m256i *)((long)plVar15 + lVar7),out,8,8);
      iVar5 = local_8082;
      out = out + 0x40;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x100);
    palVar11 = palVar11 + 1;
    plVar15 = plVar15 + 0x100;
    bVar17 = uVar14 < 0x38;
    uVar14 = uVar14 + 8;
  } while (bVar17);
  lVar7 = 0;
  do {
    puVar12 = puVar12 + 0x40;
    fdct64_avx2((__m256i *)(local_4060 + lVar7 * 8),(__m256i *)(local_8060 + lVar7 * 8),iVar5,4,
                (int)pbVar13);
    fdct64_avx2((__m256i *)(alStack_4050 + lVar7 * 8 + 2),(__m256i *)(local_8040 + lVar7 * 8),iVar5,
                4,(int)pbVar13);
    bVar1 = local_8078[2];
    if ((char)bVar1 < '\0') {
      iVar6 = 1 << (~bVar1 & 0x1f);
      auVar22._4_4_ = iVar6;
      auVar22._0_4_ = iVar6;
      auVar22._8_4_ = iVar6;
      auVar22._12_4_ = iVar6;
      auVar22._16_4_ = iVar6;
      auVar22._20_4_ = iVar6;
      auVar22._24_4_ = iVar6;
      auVar22._28_4_ = iVar6;
      lVar10 = 0;
      do {
        auVar18 = vpaddd_avx2(auVar22,*(undefined1 (*) [32])(puVar12 + lVar10));
        auVar18 = vpsrad_avx2(auVar18,ZEXT416((uint)-(int)(char)bVar1));
        *(undefined1 (*) [32])(puVar12 + lVar10) = auVar18;
        lVar10 = lVar10 + 0x80;
      } while (lVar10 != 0x1000);
    }
    else if (bVar1 != 0) {
      lVar10 = 0;
      do {
        auVar18 = vpslld_avx2(*(undefined1 (*) [32])(puVar12 + lVar10),
                              ZEXT416((uint)(int)(char)bVar1));
        *(undefined1 (*) [32])(puVar12 + lVar10) = auVar18;
        lVar10 = lVar10 + 0x80;
      } while (lVar10 != 0x1000);
    }
    bVar1 = local_8078[2];
    if ((char)bVar1 < '\0') {
      iVar6 = 1 << (~bVar1 & 0x1f);
      auVar23._4_4_ = iVar6;
      auVar23._0_4_ = iVar6;
      auVar23._8_4_ = iVar6;
      auVar23._12_4_ = iVar6;
      auVar23._16_4_ = iVar6;
      auVar23._20_4_ = iVar6;
      auVar23._24_4_ = iVar6;
      auVar23._28_4_ = iVar6;
      lVar10 = 0x20;
      do {
        auVar18 = vpaddd_avx2(auVar23,*(undefined1 (*) [32])(puVar12 + lVar10));
        auVar18 = vpsrad_avx2(auVar18,ZEXT416((uint)-(int)(char)bVar1));
        *(undefined1 (*) [32])(puVar12 + lVar10) = auVar18;
        lVar10 = lVar10 + 0x80;
      } while (lVar10 != 0x1020);
    }
    else if (bVar1 != 0) {
      lVar10 = 0x20;
      do {
        auVar18 = vpslld_avx2(*(undefined1 (*) [32])(puVar12 + lVar10),
                              ZEXT416((uint)(int)(char)bVar1));
        *(undefined1 (*) [32])(puVar12 + lVar10) = auVar18;
        lVar10 = lVar10 + 0x80;
      } while (lVar10 != 0x1020);
    }
    bVar17 = lVar7 == 0;
    lVar7 = lVar7 + 1;
  } while (bVar17);
  memcpy(local_8070,local_8060,0x1000);
  return;
}

Assistant:

void av1_fwd_txfm2d_64x64_avx2(const int16_t *input, int32_t *output,
                               int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X64;
  __m256i buf0[512], buf1[512];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = fdct64_avx2;
  const transform_1d_avx2 row_txfm = fdct64_avx2;
  const int width_div16 = (width >> 4);
  const int width_div8 = (width >> 3);
  int r, c;
  for (int i = 0; i < width_div16; i++) {
    load_buffer_16xn_avx2(input + (i << 4), &buf0[i << 1], stride, height,
                          width_div8, 0, 0);
    round_shift_32_8xn_avx2(&buf0[i << 1], height, shift[0], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[0], width_div8);
    col_txfm(&buf0[i << 1], &buf0[i << 1], cos_bit_col, width_div8, width_div8);
    col_txfm(&buf0[(i << 1) + 1], &buf0[(i << 1) + 1], cos_bit_col, width_div8,
             width_div8);
    round_shift_32_8xn_avx2(&buf0[i << 1], height, shift[1], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[1], width_div8);
  }

  for (r = 0; r < height; r += 8) {
    for (c = 0; c < width_div8; c++) {
      fwd_txfm_transpose_8x8_avx2(&buf0[r * width_div8 + c],
                                  &buf1[c * 8 * width_div8 + (r >> 3)],
                                  width_div8, width_div8);
    }
  }

  for (int i = 0; i < 2; i++) {
    row_txfm(&buf1[i << 1], &buf0[i << 1], cos_bit_row, width_div8,
             width_div16);
    row_txfm(&buf1[(i << 1) + 1], &buf0[(i << 1) + 1], cos_bit_row, width_div8,
             width_div16);
    round_shift_32_8xn_avx2(&buf0[i << 1], (height >> 1), shift[2],
                            width_div16);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], (height >> 1), shift[2],
                            width_div16);
  }

  store_buffer_avx2(buf0, output, 8, 128);
}